

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O2

int hitval(obj *otmp,monst *mon)

{
  char cVar1;
  short sVar2;
  permonst *ppVar3;
  bool bVar4;
  boolean bVar5;
  int iVar6;
  void *pvVar7;
  int iVar8;
  
  if (otmp == (obj *)0x0) {
    return 0;
  }
  cVar1 = otmp->oclass;
  if (cVar1 != '\x02') {
    bVar4 = true;
    iVar8 = 0;
    if ((cVar1 != '\x06') || (iVar8 = 0, objects[otmp->otyp].oc_subtyp == '\0')) goto LAB_0026e6cd;
  }
  iVar8 = (int)otmp->spe;
  bVar4 = false;
LAB_0026e6cd:
  ppVar3 = mon->data;
  sVar2 = otmp->otyp;
  iVar8 = objects[sVar2].oc_oc1 + iVar8;
  iVar6 = iVar8;
  if (((!bVar4) && ((otmp->field_0x4a & 2) != 0)) &&
     (iVar6 = iVar8 + 2, (ppVar3->mflags2 & 0x202) == 0)) {
    iVar6 = iVar8;
  }
  iVar8 = iVar6;
  if ((cVar1 == '\x02') && ((objects[sVar2].oc_subtyp & 0xfeU) == 0x12)) {
    pvVar7 = memchr("2\x1e$(\"",(int)ppVar3->mlet,6);
    iVar8 = iVar6 + 2;
    if (pvVar7 == (void *)0x0) {
      iVar8 = iVar6;
    }
  }
  if ((sVar2 == 0x10) && ((ppVar3->mflags1 & 2) != 0)) {
    bVar5 = is_pool(level,(int)mon->mx,(int)mon->my);
    if (bVar5 == '\0') {
      if ((ppVar3->mlet == '9') || (ppVar3->mlet == '-')) {
        iVar8 = iVar8 + 2;
      }
    }
    else {
      iVar8 = iVar8 + 4;
    }
  }
  iVar6 = iVar8;
  if ((((byte)(otmp->oclass | 4U) == 6) && (objects[otmp->otyp].oc_subtyp == '\x04')) &&
     (iVar6 = iVar8 + 2, (~ppVar3->mflags1 & 0x200008) != 0)) {
    iVar6 = iVar8;
  }
  if (otmp->oartifact != '\0') {
    iVar8 = spec_abon(otmp,mon);
    iVar6 = iVar8 + iVar6;
  }
  return iVar6;
}

Assistant:

int hitval(struct obj *otmp, struct monst *mon)
{
	int	tmp = 0;
	const struct permonst *ptr = mon->data;
	boolean Is_weapon = FALSE;

	/* not using a weapon; no special bonuses */
	if (!otmp) return 0;

	Is_weapon = (otmp->oclass == WEAPON_CLASS || is_weptool(otmp));

	if (Is_weapon)
		tmp += otmp->spe;

/*	Put weapon specific "to hit" bonuses in below:		*/
	tmp += objects[otmp->otyp].oc_hitbon;

/*	Put weapon vs. monster type "to hit" bonuses in below:	*/

	/* Blessed weapons used against undead or demons */
	if (Is_weapon && otmp->blessed &&
	   (is_demon(ptr) || is_undead(ptr))) tmp += 2;

	if (is_spear(otmp) &&
	   strchr(kebabable, ptr->mlet)) tmp += 2;

	/* trident is highly effective against swimmers */
	if (otmp->otyp == TRIDENT && is_swimmer(ptr)) {
	   if (is_pool(level, mon->mx, mon->my)) tmp += 4;
	   else if (ptr->mlet == S_EEL || ptr->mlet == S_SNAKE) tmp += 2;
	}

	/* Picks used against xorns and earth elementals */
	if (is_pick(otmp) &&
	   (passes_walls(ptr) && thick_skinned(ptr))) tmp += 2;

#ifdef INVISIBLE_OBJECTS
	/* Invisible weapons against monsters who can't see invisible */
	if (otmp->oinvis && !perceives(ptr)) tmp += 3;
#endif

	/* Check specially named weapon "to hit" bonuses */
	if (otmp->oartifact) tmp += spec_abon(otmp, mon);

	return tmp;
}